

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::insert(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
         *this,LocalSet **x)

{
  bool bVar1;
  InsertResult IVar2;
  iterator __first;
  iterator ppLVar3;
  LocalSet **x_local;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_local;
  
  bVar1 = usingFixed(this);
  if (bVar1) {
    IVar2 = OrderedFixedStorage<wasm::LocalSet_*,_2UL>::insert(&this->fixed,x);
    if (IVar2 == CouldNotInsert) {
      if ((this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used != 2) {
        __assert_fail("fixed.used == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa7,
                      "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, std::set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::set<wasm::LocalSet *>]"
                     );
      }
      bVar1 = std::
              set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
              ::empty(&this->flexible);
      if (!bVar1) {
        __assert_fail("flexible.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa8,
                      "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, std::set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::set<wasm::LocalSet *>]"
                     );
      }
      __first = std::array<wasm::LocalSet_*,_2UL>::begin
                          (&(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage);
      ppLVar3 = std::array<wasm::LocalSet_*,_2UL>::begin
                          (&(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage);
      std::set<wasm::LocalSet*,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>::
      insert<wasm::LocalSet**>
                ((set<wasm::LocalSet*,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>> *)
                 &this->flexible,__first,
                 ppLVar3 + (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used);
      std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
      insert(&this->flexible,x);
      bVar1 = usingFixed(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!usingFixed()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xac,
                      "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, std::set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::set<wasm::LocalSet *>]"
                     );
      }
      (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used = 0;
    }
  }
  else {
    std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
    insert(&this->flexible,x);
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }